

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::analysis::Matrix::IsSameImpl(Matrix *this,Type *that,IsSameCache *seen)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  bool local_39;
  Matrix *mt;
  IsSameCache *seen_local;
  Type *that_local;
  Matrix *this_local;
  long lVar3;
  
  iVar1 = (*that->_vptr_Type[0x10])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (lVar3 == 0) {
    this_local._7_1_ = false;
  }
  else {
    local_39 = false;
    if (this->count_ == *(uint32_t *)(lVar3 + 0x30)) {
      uVar2 = (*this->element_type_->_vptr_Type[2])
                        (this->element_type_,*(undefined8 *)(lVar3 + 0x28),seen);
      local_39 = false;
      if ((uVar2 & 1) != 0) {
        local_39 = Type::HasSameDecorations(&this->super_Type,that);
      }
    }
    this_local._7_1_ = local_39;
  }
  return this_local._7_1_;
}

Assistant:

bool Matrix::IsSameImpl(const Type* that, IsSameCache* seen) const {
  const Matrix* mt = that->AsMatrix();
  if (!mt) return false;
  return count_ == mt->count_ &&
         element_type_->IsSameImpl(mt->element_type_, seen) &&
         HasSameDecorations(that);
}